

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qsslerror.cpp
# Opt level: O2

QString * __thiscall QSslError::errorString(QString *__return_storage_ptr__,QSslError *this)

{
  qsizetype qVar1;
  Data *pDVar2;
  char16_t *pcVar3;
  char *s;
  long in_FS_OFFSET;
  QArrayDataPointer<char16_t> local_38;
  long local_18;
  
  local_18 = *(long *)(in_FS_OFFSET + 0x28);
  (__return_storage_ptr__->d).size = 0;
  (__return_storage_ptr__->d).d = (Data *)0x0;
  (__return_storage_ptr__->d).ptr = (char16_t *)0x0;
  switch(((this->d)._M_t.
          super___uniq_ptr_impl<QSslErrorPrivate,_std::default_delete<QSslErrorPrivate>_>._M_t.
          super__Tuple_impl<0UL,_QSslErrorPrivate_*,_std::default_delete<QSslErrorPrivate>_>.
          super__Head_base<0UL,_QSslErrorPrivate_*,_false>._M_head_impl)->error) {
  case NoError:
    s = "No error";
    break;
  case UnableToGetIssuerCertificate:
    s = "The issuer certificate could not be found";
    break;
  case UnableToDecryptCertificateSignature:
    s = "The certificate signature could not be decrypted";
    break;
  case UnableToDecodeIssuerPublicKey:
    s = "The public key in the certificate could not be read";
    break;
  case CertificateSignatureFailed:
    s = "The signature of the certificate is invalid";
    break;
  case CertificateNotYetValid:
    s = "The certificate is not yet valid";
    break;
  case CertificateExpired:
    s = "The certificate has expired";
    break;
  case InvalidNotBeforeField:
    s = "The certificate\'s notBefore field contains an invalid time";
    break;
  case InvalidNotAfterField:
    s = "The certificate\'s notAfter field contains an invalid time";
    break;
  case SelfSignedCertificate:
    s = "The certificate is self-signed, and untrusted";
    break;
  case SelfSignedCertificateInChain:
    s = "The root certificate of the certificate chain is self-signed, and untrusted";
    break;
  case UnableToGetLocalIssuerCertificate:
    s = "The issuer certificate of a locally looked up certificate could not be found";
    break;
  case UnableToVerifyFirstCertificate:
    s = "No certificates could be verified";
    break;
  default:
    s = "Unknown error";
    break;
  case InvalidCaCertificate:
    s = "One of the CA certificates is invalid";
    break;
  case PathLengthExceeded:
    s = "The basicConstraints path length parameter has been exceeded";
    break;
  case InvalidPurpose:
    s = "The supplied certificate is unsuitable for this purpose";
    break;
  case CertificateUntrusted:
    s = "The root CA certificate is not trusted for this purpose";
    break;
  case CertificateRejected:
    s = "The root CA certificate is marked to reject the specified purpose";
    break;
  case SubjectIssuerMismatch:
    s = 
    "The current candidate issuer certificate was rejected because its subject name did not match the issuer name of the current certificate"
    ;
    break;
  case AuthorityIssuerSerialNumberMismatch:
    s = 
    "The current candidate issuer certificate was rejected because its issuer name and serial number was present and did not match the authority key identifier of the current certificate"
    ;
    break;
  case NoPeerCertificate:
    s = "The peer did not present any certificate";
    break;
  case HostNameMismatch:
    s = "The host name did not match any of the valid hosts for this certificate";
    break;
  case NoSslSupport:
    goto switchD_0022d136_caseD_17;
  case CertificateBlacklisted:
    s = "The peer certificate is blacklisted";
    break;
  case OcspNoResponseFound:
    s = "No OCSP status response found";
    break;
  case OcspMalformedRequest:
    s = "The OCSP status request had invalid syntax";
    break;
  case OcspMalformedResponse:
    s = "OCSP response contains an unexpected number of SingleResponse structures";
    break;
  case OcspInternalError:
    s = "OCSP responder reached an inconsistent internal state";
    break;
  case OcspTryLater:
    s = "OCSP responder was unable to return a status for the requested certificate";
    break;
  case OcspSigRequred:
    s = "The server requires the client to sign the OCSP request in order to construct a response";
    break;
  case OcspUnauthorized:
    s = "The client is not authorized to request OCSP status from this server";
    break;
  case OcspResponseCannotBeTrusted:
    s = "OCSP responder\'s identity cannot be verified";
    break;
  case OcspResponseCertIdUnknown:
    s = "The identity of a certificate in an OCSP response cannot be established";
    break;
  case OcspResponseExpired:
    s = "The certificate status response has expired";
    break;
  case OcspStatusUnknown:
    s = "The certificate\'s status is unknown";
  }
  QSslSocket::tr((QString *)&local_38,s,(char *)0x0,-1);
  pDVar2 = (__return_storage_ptr__->d).d;
  pcVar3 = (__return_storage_ptr__->d).ptr;
  (__return_storage_ptr__->d).d = local_38.d;
  (__return_storage_ptr__->d).ptr = local_38.ptr;
  qVar1 = (__return_storage_ptr__->d).size;
  (__return_storage_ptr__->d).size = local_38.size;
  local_38.d = pDVar2;
  local_38.ptr = pcVar3;
  local_38.size = qVar1;
  QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_38);
switchD_0022d136_caseD_17:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_18) {
    return __return_storage_ptr__;
  }
  __stack_chk_fail();
}

Assistant:

QString QSslError::errorString() const
{
    QString errStr;
    switch (d->error) {
    case NoError:
        errStr = QSslSocket::tr("No error");
        break;
    case UnableToGetIssuerCertificate:
        errStr = QSslSocket::tr("The issuer certificate could not be found");
        break;
    case UnableToDecryptCertificateSignature:
        errStr = QSslSocket::tr("The certificate signature could not be decrypted");
        break;
    case UnableToDecodeIssuerPublicKey:
        errStr = QSslSocket::tr("The public key in the certificate could not be read");
        break;
    case CertificateSignatureFailed:
        errStr = QSslSocket::tr("The signature of the certificate is invalid");
        break;
    case CertificateNotYetValid:
        errStr = QSslSocket::tr("The certificate is not yet valid");
        break;
    case CertificateExpired:
        errStr = QSslSocket::tr("The certificate has expired");
        break;
    case InvalidNotBeforeField:
        errStr = QSslSocket::tr("The certificate's notBefore field contains an invalid time");
        break;
    case InvalidNotAfterField:
        errStr = QSslSocket::tr("The certificate's notAfter field contains an invalid time");
        break;
    case SelfSignedCertificate:
        errStr = QSslSocket::tr("The certificate is self-signed, and untrusted");
        break;
    case SelfSignedCertificateInChain:
        errStr = QSslSocket::tr("The root certificate of the certificate chain is self-signed, and untrusted");
        break;
    case UnableToGetLocalIssuerCertificate:
        errStr = QSslSocket::tr("The issuer certificate of a locally looked up certificate could not be found");
        break;
    case UnableToVerifyFirstCertificate:
        errStr = QSslSocket::tr("No certificates could be verified");
        break;
    case InvalidCaCertificate:
        errStr = QSslSocket::tr("One of the CA certificates is invalid");
        break;
    case PathLengthExceeded:
        errStr = QSslSocket::tr("The basicConstraints path length parameter has been exceeded");
        break;
    case InvalidPurpose:
        errStr = QSslSocket::tr("The supplied certificate is unsuitable for this purpose");
        break;
    case CertificateUntrusted:
        errStr = QSslSocket::tr("The root CA certificate is not trusted for this purpose");
        break;
    case CertificateRejected:
        errStr = QSslSocket::tr("The root CA certificate is marked to reject the specified purpose");
        break;
    case SubjectIssuerMismatch: // hostname mismatch
        errStr = QSslSocket::tr("The current candidate issuer certificate was rejected because its"
                                " subject name did not match the issuer name of the current certificate");
        break;
    case AuthorityIssuerSerialNumberMismatch:
        errStr = QSslSocket::tr("The current candidate issuer certificate was rejected because"
                             " its issuer name and serial number was present and did not match the"
                             " authority key identifier of the current certificate");
        break;
    case NoPeerCertificate:
        errStr = QSslSocket::tr("The peer did not present any certificate");
        break;
    case HostNameMismatch:
        errStr = QSslSocket::tr("The host name did not match any of the valid hosts"
                             " for this certificate");
        break;
    case NoSslSupport:
        break;
    case CertificateBlacklisted:
        errStr = QSslSocket::tr("The peer certificate is blacklisted");
        break;
    case OcspNoResponseFound:
        errStr = QSslSocket::tr("No OCSP status response found");
        break;
    case OcspMalformedRequest:
        errStr = QSslSocket::tr("The OCSP status request had invalid syntax");
        break;
    case OcspMalformedResponse:
        errStr = QSslSocket::tr("OCSP response contains an unexpected number of SingleResponse structures");
        break;
    case OcspInternalError:
        errStr = QSslSocket::tr("OCSP responder reached an inconsistent internal state");
        break;
    case OcspTryLater:
        errStr = QSslSocket::tr("OCSP responder was unable to return a status for the requested certificate");
        break;
    case OcspSigRequred:
        errStr = QSslSocket::tr("The server requires the client to sign the OCSP request in order to construct a response");
        break;
    case OcspUnauthorized:
        errStr = QSslSocket::tr("The client is not authorized to request OCSP status from this server");
        break;
    case OcspResponseCannotBeTrusted:
        errStr = QSslSocket::tr("OCSP responder's identity cannot be verified");
        break;
    case OcspResponseCertIdUnknown:
        errStr = QSslSocket::tr("The identity of a certificate in an OCSP response cannot be established");
        break;
    case OcspResponseExpired:
        errStr = QSslSocket::tr("The certificate status response has expired");
        break;
    case OcspStatusUnknown:
        errStr = QSslSocket::tr("The certificate's status is unknown");
        break;
    default:
        errStr = QSslSocket::tr("Unknown error");
        break;
    }

    return errStr;
}